

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
eglu::toLegacyAttribList
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,EGLAttrib *attribs)

{
  InternalError *this;
  value_type_conflict1 local_48;
  value_type_conflict1 local_44;
  value_type_conflict1 local_40 [4];
  ulong *local_30;
  EGLAttrib *attrib;
  undefined8 local_20;
  deUint64 attribMask;
  EGLAttrib *attribs_local;
  vector<int,_std::allocator<int>_> *legacyAttribs;
  
  local_20 = 0xffffffff;
  attrib._7_1_ = 0;
  attribMask = (deUint64)attribs;
  attribs_local = (EGLAttrib *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  if (attribMask != 0) {
    for (local_30 = (ulong *)attribMask; *local_30 != 0x3038; local_30 = local_30 + 2) {
      if (((*local_30 & 0xffffffff00000000) != 0) || ((local_30[1] & 0xffffffff00000000) != 0)) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (this,"Failed to translate EGLAttrib to EGLint",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
                   ,0x1ac);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      local_40[0] = (value_type_conflict1)*local_30;
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_40);
      local_44 = (value_type_conflict1)local_30[1];
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_44);
    }
  }
  local_48 = 0x3038;
  std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_48);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> toLegacyAttribList (const EGLAttrib* attribs)
{
	const deUint64	attribMask		= 0xffffffffull;	//!< Max bits that can be used
	vector<EGLint>	legacyAttribs;

	if (attribs)
	{
		for (const EGLAttrib* attrib = attribs; *attrib != EGL_NONE; attrib += 2)
		{
			if ((attrib[0] & ~attribMask) || (attrib[1] & ~attribMask))
				throw tcu::InternalError("Failed to translate EGLAttrib to EGLint", DE_NULL, __FILE__, __LINE__);

			legacyAttribs.push_back((EGLint)attrib[0]);
			legacyAttribs.push_back((EGLint)attrib[1]);
		}
	}

	legacyAttribs.push_back(EGL_NONE);

	return legacyAttribs;
}